

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool __thiscall xatlas::internal::SplitEdge::operator<(SplitEdge *this,SplitEdge *other)

{
  SplitEdge *other_local;
  SplitEdge *this_local;
  
  if (this->edge < other->edge) {
    this_local._7_1_ = true;
  }
  else if ((this->edge != other->edge) || (other->t <= this->t)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const SplitEdge &other) const
	{
		if (edge < other.edge)
			return true;
		else if (edge == other.edge) {
			if (t < other.t)
				return true;
		}
		return false;
	}